

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O3

void __thiscall kj::_::BTreeImpl::growTree(BTreeImpl *this,uint minCapacity)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Fault f;
  void *allocPtr;
  Fault local_38;
  NodeUnion *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar2 = this->treeCapacity * 2;
  if (uVar2 < minCapacity) {
    uVar2 = minCapacity;
  }
  uVar4 = 4;
  if (4 < uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar3 = (uint)uVar4;
  this->freelistSize = (this->freelistSize - this->treeCapacity) + uVar3;
  iVar1 = posix_memalign(&local_30,0x40,uVar4 << 6);
  if (iVar1 == 0) {
    memcpy(local_30,this->tree,(ulong)this->treeCapacity << 6);
    memset(local_30 + this->treeCapacity,0,(ulong)(uVar3 - this->treeCapacity) << 6);
    if (this->tree != (NodeUnion *)EMPTY_NODE) {
      free(this->tree);
    }
    this->tree = local_30;
    this->treeCapacity = uVar3;
    return;
  }
  local_38.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  Debug::Fault::init(&local_38,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                    );
  Debug::Fault::fatal(&local_38);
}

Assistant:

void BTreeImpl::growTree(uint minCapacity) {
  uint newCapacity = kj::max(kj::max(minCapacity, treeCapacity * 2), 4);
  freelistSize += newCapacity - treeCapacity;

  // Allocate some aligned memory! In theory this should be as simple as calling the C11 standard
  // aligned_alloc() function. Unfortunately, many platforms don't implement it. Luckily, there
  // are usually alternatives.

#if _WIN32
  // Windows lacks aligned_alloc() but has its own _aligned_malloc() (which requires freeing using
  // _aligned_free()).
  // WATCH OUT: The argument order for _aligned_malloc() is opposite of aligned_alloc()!
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
      _aligned_malloc(newCapacity * sizeof(BTreeImpl::NodeUnion), sizeof(BTreeImpl::NodeUnion)));
  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);
#else
  // macOS, OpenBSD, and Android lack aligned_alloc(), but have posix_memalign(). Fine.
  void* allocPtr;
  int error = posix_memalign(&allocPtr,
      sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion));
  if (error != 0) {
    KJ_FAIL_SYSCALL("posix_memalign", error);
  }
  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(allocPtr);
#endif

  // Note: C11 introduces aligned_alloc() as a standard, but it's still missing on many platforms,
  //   so we don't use it. But if you wanted to use it, you'd do this:
//  NodeUnion* newTree = reinterpret_cast<NodeUnion*>(
//      aligned_alloc(sizeof(BTreeImpl::NodeUnion), newCapacity * sizeof(BTreeImpl::NodeUnion)));
//  KJ_ASSERT(newTree != nullptr, "memory allocation failed", newCapacity);

  acopy(newTree, tree, treeCapacity);
  azero(newTree + treeCapacity, newCapacity - treeCapacity);
  if (tree != &EMPTY_NODE) aligned_free(tree);
  tree = newTree;
  treeCapacity = newCapacity;
}